

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::Generators::Generators<int>::populate(Generators<int> *this,int *val)

{
  int *in_stack_00000008;
  GeneratorWrapper<int> *in_stack_ffffffffffffffd8;
  vector<Catch::Generators::GeneratorWrapper<int>,_std::allocator<Catch::Generators::GeneratorWrapper<int>_>_>
  *in_stack_ffffffffffffffe0;
  
  value<int>(in_stack_00000008);
  std::
  vector<Catch::Generators::GeneratorWrapper<int>,std::allocator<Catch::Generators::GeneratorWrapper<int>>>
  ::emplace_back<Catch::Generators::GeneratorWrapper<int>>
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  GeneratorWrapper<int>::~GeneratorWrapper((GeneratorWrapper<int> *)0x185619);
  return;
}

Assistant:

void populate(T&& val) {
            m_generators.emplace_back(value(std::forward<T>(val)));
        }